

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# terminal.c
# Opt level: O2

void term_paste_callback(void *vterm)

{
  long lVar1;
  long lVar2;
  int iVar3;
  strbuf *buf_o;
  int iVar4;
  long lVar5;
  long lVar6;
  
  iVar3 = *(int *)((long)vterm + 0x10d8);
  if (iVar3 != 0) {
    iVar4 = *(int *)((long)vterm + 0x10dc);
    while (iVar4 < iVar3) {
      lVar2 = (long)iVar4 * 4;
      lVar5 = 0;
      do {
        lVar6 = lVar5;
        if ((long)iVar3 <= iVar4 + lVar5) break;
        lVar6 = lVar5 + 1;
        lVar1 = lVar5 * 4;
        lVar5 = lVar6;
      } while (*(int *)(*(long *)((long)vterm + 0x10d0) + lVar2 + lVar1) != 0xd);
      if (*(long *)((long)vterm + 0x10e8) != 0) {
        buf_o = term_input_data_from_unicode
                          ((Terminal *)vterm,(wchar_t *)(lVar2 + *(long *)((long)vterm + 0x10d0)),
                           (wchar_t)lVar6);
        term_keyinput_internal((Terminal *)vterm,buf_o->s,(wchar_t)buf_o->len,false);
        strbuf_free(buf_o);
        iVar3 = *(int *)((long)vterm + 0x10d8);
        iVar4 = *(int *)((long)vterm + 0x10dc);
      }
      iVar4 = iVar4 + (wchar_t)lVar6;
      *(int *)((long)vterm + 0x10dc) = iVar4;
      if (iVar4 < iVar3) {
        queue_toplevel_callback(term_paste_callback,vterm);
        return;
      }
    }
    term_bracketed_paste_stop((Terminal *)vterm);
    safefree(*(void **)((long)vterm + 0x10d0));
    *(undefined8 *)((long)vterm + 0x10d0) = 0;
    *(undefined4 *)((long)vterm + 0x10d8) = 0;
  }
  return;
}

Assistant:

static void term_paste_callback(void *vterm)
{
    Terminal *term = (Terminal *)vterm;

    if (term->paste_len == 0)
        return;

    while (term->paste_pos < term->paste_len) {
        int n = 0;
        while (n + term->paste_pos < term->paste_len) {
            if (term->paste_buffer[term->paste_pos + n++] == '\015')
                break;
        }
        if (term->ldisc) {
            strbuf *buf = term_input_data_from_unicode(
                term, term->paste_buffer + term->paste_pos, n);
            term_keyinput_internal(term, buf->s, buf->len, false);
            strbuf_free(buf);
        }
        term->paste_pos += n;

        if (term->paste_pos < term->paste_len) {
            queue_toplevel_callback(term_paste_callback, term);
            return;
        }
    }
    term_bracketed_paste_stop(term);
    sfree(term->paste_buffer);
    term->paste_buffer = NULL;
    term->paste_len = 0;
}